

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O0

void __thiscall slang::Diagnostics::Diagnostics(Diagnostics *this,Diagnostics *param_2)

{
  SmallVector<slang::Diagnostic,_2UL> *in_RSI;
  SmallVector<slang::Diagnostic,_2UL> *in_stack_ffffffffffffffe8;
  
  SmallVector<slang::Diagnostic,_2UL>::SmallVector(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

class SLANG_EXPORT Diagnostics : public SmallVector<Diagnostic> {
public:
    /// Adds a new diagnostic to the collection, pointing to the given source location.
    Diagnostic& add(DiagCode code, SourceLocation location);

    /// Adds a new diagnostic to the collection, highlighting the given source range.
    Diagnostic& add(DiagCode code, SourceRange range);

    /// Adds a new diagnostic to the collection, pointing to the given source location.
    Diagnostic& add(const ast::Symbol& source, DiagCode code, SourceLocation location);

    /// Adds a new diagnostic to the collection, highlighting the given source range.
    Diagnostic& add(const ast::Symbol& source, DiagCode code, SourceRange range);

    /// Sorts the diagnostics in the collection based on source file and line number.
    void sort(const SourceManager& sourceManager);

    /// Returns a copy of this collection with all diagnostics that match any of
    /// the codes given in @a list filtered out.
    Diagnostics filter(std::initializer_list<DiagCode> list) const;
}